

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O3

HighsInt create(HighsIndexCollection *index_collection,HighsInt *mask,HighsInt dimension)

{
  pointer piVar1;
  allocator_type local_29;
  pointer local_28;
  pointer piStack_20;
  pointer local_18;
  
  if (-1 < dimension) {
    index_collection->dimension_ = dimension;
    index_collection->is_mask_ = true;
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_28,mask,mask + (uint)dimension,&local_29);
    piVar1 = (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = local_28;
    (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piStack_20;
    (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_18;
    local_28 = (pointer)0x0;
    piStack_20 = (pointer)0x0;
    local_18 = (pointer)0x0;
    if (piVar1 != (pointer)0x0) {
      operator_delete(piVar1);
      if (local_28 != (pointer)0x0) {
        operator_delete(local_28);
      }
    }
    return 0;
  }
  return 1;
}

Assistant:

HighsInt create(HighsIndexCollection& index_collection, const HighsInt* mask,
                const HighsInt dimension) {
  // Create an index collection for the given mask
  if (dimension < 0) return kIndexCollectionCreateIllegalMaskSize;
  index_collection.dimension_ = dimension;
  index_collection.is_mask_ = true;
  index_collection.mask_ = {mask, mask + dimension};
  return kIndexCollectionCreateOk;
}